

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getSaveGamesFolder1.cpp
# Opt level: O3

int main(void)

{
  PlatformFolders p;
  PlatformFolders PStack_38;
  string local_30;
  
  sago::getSaveGamesFolder1_abi_cxx11_();
  run_test(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  sago::PlatformFolders::PlatformFolders(&PStack_38);
  sago::PlatformFolders::getSaveGamesFolder1_abi_cxx11_(&local_30,&PStack_38);
  run_test(&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  sago::PlatformFolders::~PlatformFolders(&PStack_38);
  return 0;
}

Assistant:

int main() {
	run_test(sago::getSaveGamesFolder1());
	sago::PlatformFolders p;
	run_test(p.getSaveGamesFolder1());
	return 0;
}